

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

char * testing::internal::String::CloneCString(char *c_str)

{
  size_t length;
  undefined8 local_18;
  char *c_str_local;
  
  if (c_str == (char *)0x0) {
    local_18 = (char *)0x0;
  }
  else {
    length = strlen(c_str);
    local_18 = CloneString(c_str,length);
  }
  return local_18;
}

Assistant:

const char * String::CloneCString(const char* c_str) {
  return (c_str == NULL) ?
                    NULL : CloneString(c_str, strlen(c_str));
}